

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distorm.c
# Opt level: O0

void distorm_format_signed_disp(uchar **str,_DInst *di,uint64_t addrMask)

{
  ulong in_RDX;
  long in_RSI;
  uchar **in_RDI;
  int64_t tmpDisp64;
  uint64_t local_20;
  
  if (*(char *)(in_RSI + 0x37) != '\0') {
    if (*(long *)(in_RSI + 8) < 0) {
      **in_RDI = '-';
      *in_RDI = *in_RDI + 1;
      local_20 = in_RDX & -*(long *)(in_RSI + 8);
    }
    else {
      **in_RDI = '+';
      *in_RDI = *in_RDI + 1;
      local_20 = *(uint64_t *)(in_RSI + 8);
    }
    str_int_impl(in_RDI,local_20);
  }
  return;
}

Assistant:

static void distorm_format_signed_disp(unsigned char** str, const _DInst* di, uint64_t addrMask)
{
	int64_t tmpDisp64;

	if (di->dispSize) {
		if (((int64_t)di->disp < 0)) {
			chrcat_WS(*str, MINUS_DISP_CHR);
			tmpDisp64 = -(int64_t)di->disp;
			tmpDisp64 &= addrMask; /* Verify only for neg numbers. */
		}
		else {
			chrcat_WS(*str, PLUS_DISP_CHR);
			tmpDisp64 = di->disp;
		}
		str_int(str, tmpDisp64);
	}
}